

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O3

Result * CoreML::validateDoubleParameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   DoubleParameter *doubleParameter)

{
  double *pdVar1;
  double dVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string err;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (doubleParameter->_oneof_case_[0] == 10) {
    dVar2 = doubleParameter->defaultvalue_;
    if ((dVar2 < ((doubleParameter->AllowedValues_).range_)->minvalue_) ||
       (pdVar1 = &((doubleParameter->AllowedValues_).range_)->maxvalue_,
       *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_48,vsnprintf,0x148,"%f");
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x3bb2ac);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_98 = *plVar4;
        lStack_90 = plVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar4;
        local_a8 = (long *)*plVar3;
      }
      local_a0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_78 = *plVar4;
        lStack_70 = plVar3[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar4;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_88,(ulong)(parameterName->_M_dataplus)._M_p);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_58 = *plVar4;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar4;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_c8.field_2._M_allocated_capacity = *psVar5;
        local_c8.field_2._8_8_ = plVar3[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar5;
        local_c8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_c8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateDoubleParameter(const std::string& parameterName, const Specification::DoubleParameter& doubleParameter) {

    auto defaultValue = doubleParameter.defaultvalue();

    if (doubleParameter.has_range()) {
        const Specification::DoubleRange& range = doubleParameter.range();

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    return Result();
}